

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_mristep.c
# Opt level: O1

int mriStep_ComputeInnerForcing(ARKodeMRIStepMem step_mem,int stage,realtype cdiff)

{
  realtype *c;
  N_Vector *X;
  int *piVar1;
  MRIStepCoupling pMVar2;
  long lVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  realtype *prVar7;
  ulong uVar8;
  realtype ****pppprVar9;
  long lVar10;
  
  c = step_mem->cvals;
  X = step_mem->Xvecs;
  if (0 < stage) {
    iVar6 = step_mem->explicit_rhs;
    iVar5 = step_mem->implicit_rhs;
    uVar8 = 0;
    iVar4 = 0;
    do {
      if ((iVar6 != 0) && (-1 < (long)step_mem->stage_map[uVar8])) {
        X[iVar4] = step_mem->Fse[step_mem->stage_map[uVar8]];
        iVar4 = iVar4 + 1;
      }
      if ((iVar5 != 0) && (-1 < (long)step_mem->stage_map[uVar8])) {
        X[iVar4] = step_mem->Fsi[step_mem->stage_map[uVar8]];
        iVar4 = iVar4 + 1;
      }
      uVar8 = uVar8 + 1;
    } while ((uint)stage != uVar8);
  }
  lVar3 = (long)step_mem->MRIC->nmat;
  if (0 < lVar3) {
    lVar10 = 0;
    do {
      iVar6 = 0;
      if (0 < stage) {
        piVar1 = step_mem->stage_map;
        uVar8 = 0;
        iVar6 = 0;
        do {
          if (-1 < piVar1[uVar8]) {
            if (step_mem->explicit_rhs == 0) {
LAB_00413825:
              pppprVar9 = &step_mem->MRIC->G;
LAB_0041382d:
              iVar5 = 1;
              prVar7 = c;
            }
            else {
              if (step_mem->implicit_rhs == 0) {
                if (step_mem->explicit_rhs == 0) goto LAB_00413825;
                pppprVar9 = &step_mem->MRIC->W;
                goto LAB_0041382d;
              }
              pMVar2 = step_mem->MRIC;
              c[iVar6] = pMVar2->W[lVar10][stage][uVar8] * (1.0 / cdiff);
              pppprVar9 = &pMVar2->G;
              iVar5 = 2;
              prVar7 = c + 1;
            }
            prVar7[iVar6] = (*pppprVar9)[lVar10][stage][uVar8] * (1.0 / cdiff);
            iVar6 = iVar6 + iVar5;
          }
          uVar8 = uVar8 + 1;
        } while ((uint)stage != uVar8);
      }
      iVar6 = N_VLinearCombination(iVar6,c,X,step_mem->stepper->forcing[lVar10]);
      if (iVar6 != 0) {
        return -0x1c;
      }
      lVar10 = lVar10 + 1;
    } while (lVar10 != lVar3);
  }
  return 0;
}

Assistant:

int mriStep_ComputeInnerForcing(ARKodeMRIStepMem step_mem,
                                int stage, realtype cdiff)
{
  realtype  rcdiff;
  int       j, k, nmat, nstore, retval;
  realtype* cvals;
  N_Vector* Xvecs;

  /* local shortcuts for fused vector operations */
  cvals = step_mem->cvals;
  Xvecs = step_mem->Xvecs;

  /* compute inner forcing vectors (assumes cdiff != 0) */
  nstore = 0;
  for (j = 0; j < stage; j++) {
    if (step_mem->explicit_rhs && step_mem->stage_map[j] > -1) {
      Xvecs[nstore] = step_mem->Fse[step_mem->stage_map[j]];
      nstore += 1;
    }
    if (step_mem->implicit_rhs && step_mem->stage_map[j] > -1) {
      Xvecs[nstore] = step_mem->Fsi[step_mem->stage_map[j]];
      nstore += 1;
    }
  }

  nmat   = step_mem->MRIC->nmat;
  rcdiff = ONE / cdiff;

  for (k = 0; k < nmat; k++) {
    nstore = 0;
    for (j = 0; j < stage; j++) {
      if (step_mem->stage_map[j] > -1) {
        if (step_mem->explicit_rhs && step_mem->implicit_rhs) {
          /* ImEx */
          cvals[nstore] = rcdiff * step_mem->MRIC->W[k][stage][j];
          nstore += 1;
          cvals[nstore] = rcdiff * step_mem->MRIC->G[k][stage][j];
          nstore += 1;
        } else if (step_mem->explicit_rhs) {
          /* explicit only */
          cvals[nstore] = rcdiff * step_mem->MRIC->W[k][stage][j];
          nstore += 1;
        } else {
          /* implicit only */
          cvals[nstore] = rcdiff * step_mem->MRIC->G[k][stage][j];
          nstore += 1;
        }
      }
    }

    retval = N_VLinearCombination(nstore, cvals, Xvecs,
                                  step_mem->stepper->forcing[k]);
    if (retval != 0) return(ARK_VECTOROP_ERR);
  }

#ifdef SUNDIALS_DEBUG_PRINTVEC
  for (k = 0; k < nmat; k++) {
    printf("    MRIStep forcing[%i]:\n", k);
    N_VPrint(step_mem->stepper->forcing[k]);
  }
#endif

  return(ARK_SUCCESS);
}